

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zStream.c
# Opt level: O3

SRes LookInStream_Read2(ILookInStream *stream,void *buf,size_t size,SRes errorType)

{
  SRes SVar1;
  size_t processed;
  size_t local_38;
  
  if (size != 0) {
    do {
      local_38 = size;
      SVar1 = (*stream->Read)(stream,buf,&local_38);
      if (SVar1 != 0) {
        return SVar1;
      }
      if (local_38 == 0) {
        return errorType;
      }
      buf = (void *)((long)buf + local_38);
      size = size - local_38;
    } while (size != 0);
  }
  return 0;
}

Assistant:

SRes LookInStream_Read2(ILookInStream *stream, void *buf, size_t size, SRes errorType)
{
  while (size != 0)
  {
    size_t processed = size;
    RINOK(stream->Read(stream, buf, &processed));
    if (processed == 0)
      return errorType;
    buf = (void *)((Byte *)buf + processed);
    size -= processed;
  }
  return SZ_OK;
}